

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  uVar7 = (long)end - (long)ptr;
  if ((long)uVar7 < 2) {
    return -1;
  }
  bVar1 = *ptr;
  iVar5 = 0;
  pcVar4 = ptr;
  if (bVar1 - 0xd8 < 4) {
LAB_0060ab61:
    iVar6 = iVar5;
    if (uVar7 < 4) {
      return -2;
    }
  }
  else {
    iVar6 = 0;
    if (bVar1 - 0xdc < 4) goto LAB_0060abab;
    if (bVar1 == 0) {
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      if (cVar2 == '\x06') {
        iVar6 = iVar5;
        if (uVar7 == 2) {
          return -2;
        }
        goto LAB_0060abab;
      }
      if (cVar2 == '\a') goto LAB_0060ab61;
      if (cVar2 == '\x13') {
        pcVar4 = ptr + 2;
        if ((long)end - (long)pcVar4 < 2) {
          return -1;
        }
        iVar6 = iVar5;
        if (*pcVar4 == '\0') {
          if ((ulong)(byte)ptr[3] == 0x78) {
            pcVar4 = ptr + 4;
            if ((long)end - (long)pcVar4 < 2) {
              return -1;
            }
            if ((*pcVar4 == '\0') &&
               ((*(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[5]) & 0xfe) == 0x18)) {
              pcVar4 = ptr + 6;
              lVar8 = uVar7 - 6;
              while( true ) {
                if (lVar8 < 2) {
                  return -1;
                }
                if (*pcVar4 != '\0') goto LAB_0060abab;
                bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)pcVar4[1]);
                if (1 < bVar1 - 0x18) break;
                pcVar4 = pcVar4 + 2;
                lVar8 = lVar8 + -2;
              }
              if (bVar1 == 0x12) {
                pcVar4 = pcVar4 + 2;
                iVar6 = 10;
              }
            }
          }
          else if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[3]) == '\x19') {
            lVar8 = uVar7 - 4;
            pcVar3 = ptr + 4;
            do {
              pcVar4 = pcVar3;
              if (lVar8 < 2) {
                return -1;
              }
              if (*pcVar4 != '\0') goto LAB_0060abab;
              cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)pcVar4[1]);
              lVar8 = lVar8 + -2;
              pcVar3 = pcVar4 + 2;
            } while (cVar2 == '\x19');
            if (cVar2 == '\x12') {
              pcVar4 = pcVar4 + 2;
              iVar6 = 10;
            }
          }
        }
        goto LAB_0060abab;
      }
      if ((cVar2 == '\x16') || (cVar2 == '\x18')) goto LAB_0060aaad;
      iVar6 = iVar5;
      if (cVar2 != '\x1d') goto LAB_0060abab;
    }
    else if ((bVar1 == 0xff) && (iVar6 = iVar5, 0xfd < (byte)ptr[1])) goto LAB_0060abab;
    iVar6 = iVar5;
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)ptr[1] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
         >> ((byte)ptr[1] & 0x1f) & 1) != 0) {
LAB_0060aaad:
      pcVar4 = ptr + 4;
LAB_0060aaca:
      uVar7 = uVar7 - 2;
      if ((long)uVar7 < 2) {
        return -1;
      }
      bVar1 = pcVar4[-2];
      if (bVar1 != 0) {
        if (bVar1 == 0xff) {
          if ((byte)pcVar4[-1] < 0xfe) goto switchD_0060ab51_caseD_1d;
        }
        else if (bVar1 - 0xd8 < 4) {
LAB_0060aba1:
          if (uVar7 < 4) {
            return -2;
          }
        }
        else if (3 < bVar1 - 0xdc) goto switchD_0060ab51_caseD_1d;
        goto switchD_0060ab51_caseD_13;
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)(byte)pcVar4[-1]);
      switch(cVar2) {
      case '\x12':
        iVar6 = 9;
        goto LAB_0060abab;
      case '\x13':
      case '\x14':
      case '\x15':
      case '\x17':
      case '\x1c':
        break;
      case '\x16':
      case '\x18':
      case '\x19':
      case '\x1a':
      case '\x1b':
        goto switchD_0060ab51_caseD_16;
      case '\x1d':
switchD_0060ab51_caseD_1d:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)pcVar4[-1] >> 3 & 0x1c |
                             (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
             ((byte)pcVar4[-1] & 0x1f) & 1) != 0) goto switchD_0060ab51_caseD_16;
        break;
      default:
        if (cVar2 == '\x06') {
          if (uVar7 == 2) {
            return -2;
          }
        }
        else if (cVar2 == '\a') goto LAB_0060aba1;
      }
switchD_0060ab51_caseD_13:
      pcVar4 = pcVar4 + -2;
      iVar6 = iVar5;
    }
  }
LAB_0060abab:
  *nextTokPtr = pcVar4;
  return iVar6;
switchD_0060ab51_caseD_16:
  pcVar4 = pcVar4 + 2;
  goto LAB_0060aaca;
}

Assistant:

static int PTRCALL
PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}